

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExtraSublimeTextGenerator.cxx
# Opt level: O3

void __thiscall
cmExtraSublimeTextGenerator::AppendTarget
          (cmExtraSublimeTextGenerator *this,cmGeneratedFileStream *fout,string *targetName,
          cmLocalGenerator *lg,cmGeneratorTarget *target,char *make,cmMakefile *makefile,
          char *param_7,MapSourceFileFlags *sourceFileFlags,bool firstTarget)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmSourceFile *this_00;
  pointer pcVar2;
  cmLocalGenerator *lg_00;
  cmGeneratorTarget *target_00;
  bool bVar3;
  int iVar4;
  char *pcVar5;
  cmExtraSublimeTextGenerator *this_01;
  iterator iVar6;
  string *psVar7;
  long *plVar8;
  ostream *poVar9;
  long *plVar10;
  _Base_ptr this_02;
  pointer ppcVar11;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_bool>
  pVar12;
  string definesString;
  string workString;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> sourceFiles;
  string makefileName;
  string local_1e8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8;
  string local_1a8;
  long *local_188;
  char *local_180;
  long local_178;
  long lStack_170;
  vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_> local_168;
  string *local_148;
  cmLocalGenerator *local_140;
  pointer local_138;
  cmExtraSublimeTextGenerator *local_130;
  cmGeneratedFileStream *local_128;
  char *local_120;
  cmGeneratorTarget *local_118;
  _Base_ptr local_110;
  pointer local_108;
  undefined1 local_100 [32];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_e0 [2];
  _Alloc_hider local_b0;
  char *local_48;
  char *local_38;
  
  local_148 = targetName;
  local_140 = lg;
  local_120 = make;
  if (target != (cmGeneratorTarget *)0x0) {
    local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_1e8._M_dataplus._M_p = (pointer)&local_1e8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_1e8,"CMAKE_BUILD_TYPE","");
    pcVar5 = cmMakefile::GetSafeDefinition(makefile,&local_1e8);
    std::__cxx11::string::string((string *)local_100,pcVar5,(allocator *)&local_1a8);
    cmGeneratorTarget::GetSourceFiles(target,&local_168,(string *)local_100);
    if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
      operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
      operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
    }
    local_108 = local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                _M_impl.super__Vector_impl_data._M_finish;
    if (local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start !=
        local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      local_110 = &(sourceFileFlags->_M_t)._M_impl.super__Rb_tree_header._M_header;
      ppcVar11 = local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      local_130 = this;
      local_128 = fout;
      local_118 = target;
LAB_003ac001:
      this_00 = *ppcVar11;
      this_01 = (cmExtraSublimeTextGenerator *)cmSourceFile::GetFullPath(this_00,(string *)0x0);
      iVar6 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
              ::find(&sourceFileFlags->_M_t,(key_type *)this_01);
      local_138 = ppcVar11;
      if (iVar6._M_node == local_110) {
        psVar7 = cmSourceFile::GetFullPath(this_00,(string *)0x0);
        local_1e8._M_dataplus._M_p = (pointer)0x0;
        local_1e8._M_string_length = 0;
        local_1e8.field_2._M_allocated_capacity = 0;
        local_100._0_8_ = local_100 + 0x10;
        pcVar2 = (psVar7->_M_dataplus)._M_p;
        this_01 = (cmExtraSublimeTextGenerator *)local_100;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)this_01,pcVar2,pcVar2 + psVar7->_M_string_length);
        local_e0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)local_1e8._M_dataplus._M_p;
        local_e0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_1e8._M_string_length;
        local_e0[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)local_1e8.field_2._M_allocated_capacity;
        local_1e8._M_dataplus._M_p = (pointer)0x0;
        local_1e8._M_string_length = 0;
        local_1e8.field_2._M_allocated_capacity = 0;
        pVar12 = std::
                 _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                 ::
                 _M_insert_unique<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
                           ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
                             *)sourceFileFlags,
                            (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)this_01);
        iVar6._M_node = (_Base_ptr)pVar12.first._M_node;
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(local_e0);
        if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
          this_01 = (cmExtraSublimeTextGenerator *)(CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
          operator_delete((void *)local_100._0_8_,(ulong)this_01);
        }
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&local_1e8);
      }
      target_00 = local_118;
      ppcVar11 = local_138;
      lg_00 = local_140;
      ComputeFlagsForObject_abi_cxx11_(&local_1e8,this_01,*local_138,local_140,local_118);
      ComputeDefines_abi_cxx11_(&local_1a8,this_01,*ppcVar11,lg_00,target_00);
      this_02 = iVar6._M_node + 2;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_erase_at_end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)this_02,*(pointer *)this_02);
      local_48 = (char *)0x0;
      cmsys::RegularExpression::compile
                ((RegularExpression *)local_100,
                 "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?");
      local_1c8._M_dataplus._M_p = (pointer)&local_1c8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_1c8,local_1e8._M_dataplus._M_p,
                 local_1e8._M_dataplus._M_p + local_1e8._M_string_length);
      ppcVar11 = local_138;
      std::__cxx11::string::append((char *)&local_1c8);
      plVar8 = (long *)std::__cxx11::string::_M_append
                                 ((char *)&local_1c8,(ulong)local_1a8._M_dataplus._M_p);
      plVar10 = plVar8 + 2;
      if ((long *)*plVar8 == plVar10) {
        local_178 = *plVar10;
        lStack_170 = plVar8[3];
        local_188 = &local_178;
      }
      else {
        local_178 = *plVar10;
        local_188 = (long *)*plVar8;
      }
      local_180 = (char *)plVar8[1];
      *plVar8 = (long)plVar10;
      plVar8[1] = 0;
      *(undefined1 *)(plVar8 + 2) = 0;
      do {
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
          operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
        }
        while( true ) {
          bVar3 = cmsys::RegularExpression::find((RegularExpression *)local_100,(char *)local_188);
          if (!bVar3) {
            if (local_188 != &local_178) {
              operator_delete(local_188,local_178 + 1);
            }
            if (local_48 != (char *)0x0) {
              operator_delete__(local_48);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
              operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1e8._M_dataplus._M_p != &local_1e8.field_2) {
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
            }
            ppcVar11 = ppcVar11 + 1;
            this = local_130;
            fout = local_128;
            if (ppcVar11 == local_108) goto LAB_003ac36b;
            goto LAB_003ac001;
          }
          std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&local_188);
          std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
          emplace_back<std::__cxx11::string>
                    ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this_02,
                     &local_1c8);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1c8._M_dataplus._M_p != &local_1c8.field_2) {
            operator_delete(local_1c8._M_dataplus._M_p,local_1c8.field_2._M_allocated_capacity + 1);
          }
          if (local_b0._M_p + -(long)local_38 < local_180) break;
          std::__cxx11::string::_M_replace((ulong)&local_188,0,local_180,0x5944aa);
        }
        std::__cxx11::string::substr((ulong)&local_1c8,(ulong)&local_188);
        std::__cxx11::string::operator=((string *)&local_188,(string *)&local_1c8);
      } while( true );
    }
LAB_003ac36b:
    if (local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_168.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.
                            super__Vector_base<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  }
  local_100._8_8_ = (pointer)0x0;
  local_100[0x10] = '\0';
  local_100._0_8_ = local_100 + 0x10;
  (*((this->super_cmExternalMakefileProjectGenerator).GlobalGenerator)->_vptr_cmGlobalGenerator[3])
            (&local_1e8);
  iVar4 = std::__cxx11::string::compare((char *)&local_1e8);
  paVar1 = &local_1e8.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  pcVar5 = "Makefile";
  if (iVar4 == 0) {
    pcVar5 = "build.ninja";
  }
  std::__cxx11::string::_M_replace((ulong)local_100,0,(char *)local_100._8_8_,(ulong)pcVar5);
  if (!firstTarget) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,",\n\t",3);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t{\n\t\t\t\"name\": \"",0xf);
  cmLocalGenerator::GetProjectName_abi_cxx11_(&local_1e8,local_140);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," - ",3);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar9,(local_148->_M_dataplus)._M_p,local_148->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\",\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t\t\"cmd\": [",0xb);
  std::__cxx11::string::string((string *)&local_1a8,local_120,(allocator *)&local_188);
  BuildMakeCommand(&local_1e8,this,&local_1a8,(char *)local_100._0_8_,local_148);
  poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)fout,local_1e8._M_dataplus._M_p,local_1e8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"],\n",3);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1e8._M_dataplus._M_p != paVar1) {
    operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8._M_dataplus._M_p != &local_1a8.field_2) {
    operator_delete(local_1a8._M_dataplus._M_p,local_1a8.field_2._M_allocated_capacity + 1);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,"\t\t\t\"working_dir\": \"${project_path}\",\n",0x25);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)fout,
             "\t\t\t\"file_regex\": \"^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)\"\n"
             ,0x4e);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)fout,"\t\t}",3);
  if ((undefined1 *)local_100._0_8_ != local_100 + 0x10) {
    operator_delete((void *)local_100._0_8_,CONCAT71(local_100._17_7_,local_100[0x10]) + 1);
  }
  return;
}

Assistant:

void cmExtraSublimeTextGenerator::AppendTarget(
  cmGeneratedFileStream& fout, const std::string& targetName,
  cmLocalGenerator* lg, cmGeneratorTarget* target, const char* make,
  const cmMakefile* makefile, const char* /*compiler*/,
  MapSourceFileFlags& sourceFileFlags, bool firstTarget)
{

  if (target != CM_NULLPTR) {
    std::vector<cmSourceFile*> sourceFiles;
    target->GetSourceFiles(sourceFiles,
                           makefile->GetSafeDefinition("CMAKE_BUILD_TYPE"));
    std::vector<cmSourceFile*>::const_iterator sourceFilesEnd =
      sourceFiles.end();
    for (std::vector<cmSourceFile*>::const_iterator iter = sourceFiles.begin();
         iter != sourceFilesEnd; ++iter) {
      cmSourceFile* sourceFile = *iter;
      MapSourceFileFlags::iterator sourceFileFlagsIter =
        sourceFileFlags.find(sourceFile->GetFullPath());
      if (sourceFileFlagsIter == sourceFileFlags.end()) {
        sourceFileFlagsIter =
          sourceFileFlags
            .insert(MapSourceFileFlags::value_type(sourceFile->GetFullPath(),
                                                   std::vector<std::string>()))
            .first;
      }
      std::vector<std::string>& flags = sourceFileFlagsIter->second;
      std::string flagsString = this->ComputeFlagsForObject(*iter, lg, target);
      std::string definesString = this->ComputeDefines(*iter, lg, target);
      flags.clear();
      cmsys::RegularExpression flagRegex;
      // Regular expression to extract compiler flags from a string
      // https://gist.github.com/3944250
      const char* regexString =
        "(^|[ ])-[DIOUWfgs][^= ]+(=\\\"[^\"]+\\\"|=[^\"][^ ]+)?";
      flagRegex.compile(regexString);
      std::string workString = flagsString + " " + definesString;
      while (flagRegex.find(workString)) {
        std::string::size_type start = flagRegex.start();
        if (workString[start] == ' ') {
          start++;
        }
        flags.push_back(workString.substr(start, flagRegex.end() - start));
        if (flagRegex.end() < workString.size()) {
          workString = workString.substr(flagRegex.end());
        } else {
          workString = "";
        }
      }
    }
  }

  // Ninja uses ninja.build files (look for a way to get the output file name
  // from cmMakefile or something)
  std::string makefileName;
  if (this->GlobalGenerator->GetName() == "Ninja") {
    makefileName = "build.ninja";
  } else {
    makefileName = "Makefile";
  }
  if (!firstTarget) {
    fout << ",\n\t";
  }
  fout << "\t{\n\t\t\t\"name\": \"" << lg->GetProjectName() << " - "
       << targetName << "\",\n";
  fout << "\t\t\t\"cmd\": ["
       << this->BuildMakeCommand(make, makefileName.c_str(), targetName)
       << "],\n";
  fout << "\t\t\t\"working_dir\": \"${project_path}\",\n";
  fout << "\t\t\t\"file_regex\": \""
          "^(..[^:]*)(?::|\\\\()([0-9]+)(?::|\\\\))(?:([0-9]+):)?\\\\s*(.*)"
          "\"\n";
  fout << "\t\t}";
}